

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

VerifySignTxInUtxoData * __thiscall
cfd::js::api::json::VerifySignTxInUtxoData::GetLockingScriptString_abi_cxx11_
          (VerifySignTxInUtxoData *this,VerifySignTxInUtxoData *obj)

{
  VerifySignTxInUtxoData *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->locking_script_);
  return this;
}

Assistant:

static std::string GetLockingScriptString(  // line separate
      const VerifySignTxInUtxoData& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.locking_script_);
  }